

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O0

void __thiscall egc::Sequencer::ADS(Sequencer *this,unsigned_short instruction)

{
  ostream *poVar1;
  element_type *peVar2;
  type *ptVar3;
  type *ptVar4;
  type *overflow;
  type *result;
  unsigned_short local_18;
  unsigned_short local_16;
  ushort local_14;
  unsigned_short local_12;
  unsigned_short a;
  unsigned_short mk;
  unsigned_short k;
  unsigned_short instruction_local;
  Sequencer *this_local;
  
  local_14 = instruction & 0x3ff;
  local_12 = instruction;
  _a = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"ADS");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::oct);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  local_16 = Memory::Read(peVar2,local_14,0);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  local_18 = Memory::Read(peVar2,0,0);
  result._4_4_ = AddWords(local_18,local_16);
  ptVar3 = std::get<0ul,unsigned_short,unsigned_short>
                     ((pair<unsigned_short,_unsigned_short> *)((long)&result + 4));
  ptVar4 = std::get<1ul,unsigned_short,unsigned_short>
                     ((pair<unsigned_short,_unsigned_short> *)((long)&result + 4));
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,local_14,*ptVar3);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,0,*ptVar3);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::SetAccumulatorOverflow(peVar2,*ptVar4);
  return;
}

Assistant:

void egc::Sequencer::ADS (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "ADS" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto a = m_Memory->Read(00000u);

    auto [result, overflow] = AddWords(a, mk);

    m_Memory->Write(k, result);
    m_Memory->Write(00000u, result);

    m_Memory->SetAccumulatorOverflow(overflow);
}